

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaGrammar.cpp
# Opt level: O0

XMLElementDecl * __thiscall
xercesc_4_0::SchemaGrammar::findOrAddElemDecl
          (SchemaGrammar *this,uint uriId,XMLCh *baseName,XMLCh *prefixName,XMLCh *qName,uint scope,
          bool *wasAdded)

{
  int iVar1;
  undefined4 extraout_var;
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *pRVar2;
  XMLCh *key1;
  XMLSize_t newId;
  XMLSize_t elemId;
  SchemaElementDecl *local_40;
  SchemaElementDecl *retVal;
  uint scope_local;
  XMLCh *qName_local;
  XMLCh *prefixName_local;
  XMLCh *baseName_local;
  uint uriId_local;
  SchemaGrammar *this_local;
  
  iVar1 = (*(this->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])
                    (this,(ulong)uriId,baseName,qName,(ulong)scope);
  local_40 = (SchemaElementDecl *)CONCAT44(extraout_var,iVar1);
  if (local_40 == (SchemaElementDecl *)0x0) {
    local_40 = (SchemaElementDecl *)XMemory::operator_new(0x80,this->fMemoryManager);
    SchemaElementDecl::SchemaElementDecl
              (local_40,prefixName,baseName,uriId,Any,0xfffffffe,this->fMemoryManager);
    if (this->fElemNonDeclPool ==
        (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)0x0) {
      pRVar2 = (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)
               XMemory::operator_new(0x40,this->fMemoryManager);
      RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
      RefHash3KeysIdPool(pRVar2,0x1d,true,0x80,this->fMemoryManager);
      this->fElemNonDeclPool = pRVar2;
    }
    pRVar2 = this->fElemNonDeclPool;
    key1 = XMLElementDecl::getBaseName((XMLElementDecl *)local_40);
    newId = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::put
                      (pRVar2,key1,uriId,scope,local_40);
    XMLElementDecl::setId((XMLElementDecl *)local_40,newId);
    *wasAdded = true;
  }
  else {
    *wasAdded = false;
  }
  return &local_40->super_XMLElementDecl;
}

Assistant:

XMLElementDecl* SchemaGrammar::findOrAddElemDecl (const   unsigned int    uriId
        , const XMLCh* const    baseName
        , const XMLCh* const    prefixName
        , const XMLCh* const    qName
        , unsigned int          scope
        ,       bool&           wasAdded )
{
    // See it it exists
    SchemaElementDecl* retVal = (SchemaElementDecl*) getElemDecl(uriId, baseName, qName, scope);

    // if not, then add this in
    if (!retVal)
    {
        retVal = new (fMemoryManager) SchemaElementDecl
        (
            prefixName
            , baseName
            , uriId
            , SchemaElementDecl::Any
            , Grammar::TOP_LEVEL_SCOPE
            , fMemoryManager
        );
        if(!fElemNonDeclPool)
            fElemNonDeclPool = new (fMemoryManager) RefHash3KeysIdPool<SchemaElementDecl>(29, true, 128, fMemoryManager);
        const XMLSize_t elemId = fElemNonDeclPool->put((void*)retVal->getBaseName(), uriId, scope, retVal);
        retVal->setId(elemId);
        wasAdded = true;
    }
     else
    {
        wasAdded = false;
    }
    return retVal;
}